

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_setreturns(FuncState *fs,expdesc *e,int nresults)

{
  Instruction *pIVar1;
  
  if (e->k != VVARARG) {
    if (e->k == VCALL) {
      pIVar1 = fs->f->code;
      pIVar1[(e->u).info] =
           nresults * 0x4000 + 0x4000U & 0x7fc000 | pIVar1[(e->u).info] & 0xff803fff;
    }
    return;
  }
  pIVar1 = fs->f->code;
  pIVar1[(e->u).info] =
       (nresults << 0x17 | pIVar1[(e->u).info] & 0x7fc03f) + (uint)fs->freereg * 0x40 + 0x800000;
  luaK_reserveregs(fs,1);
  return;
}

Assistant:

void luaK_setreturns (FuncState *fs, expdesc *e, int nresults) {
  Instruction *pc = &getinstruction(fs, e);
  if (e->k == VCALL)  /* expression is an open function call? */
    SETARG_C(*pc, nresults + 1);
  else {
    lua_assert(e->k == VVARARG);
    SETARG_C(*pc, nresults + 1);
    SETARG_A(*pc, fs->freereg);
    luaK_reserveregs(fs, 1);
  }
}